

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong helper_modsub_mips64(target_ulong rs,target_ulong rt)

{
  ulong uVar1;
  
  uVar1 = rt >> 8 & 0xffff;
  if ((int)rs != 0) {
    uVar1 = rs - ((uint)rt & 0xff);
  }
  return uVar1;
}

Assistant:

target_ulong helper_modsub(target_ulong rs, target_ulong rt)
{
    int32_t decr;
    uint16_t lastindex;
    target_ulong rd;

    decr = rt & MIPSDSP_Q0;
    lastindex = (rt >> 8) & MIPSDSP_LO;

    if ((rs & MIPSDSP_LLO) == 0x00000000) {
        rd = (target_ulong)lastindex;
    } else {
        rd = rs - decr;
    }

    return rd;
}